

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

long __thiscall
duckdb::Interpolator<true>::Extract<long,long>(Interpolator<true> *this,long *dest,Vector *result)

{
  duckdb *this_00;
  bool bVar1;
  undefined1 auVar2 [16];
  long result_1;
  long local_40;
  string local_38;
  
  this_00 = (duckdb *)*dest;
  bVar1 = TryCast::Operation<long,long>((int64_t)this_00,&local_40,false);
  if (bVar1) {
    return local_40;
  }
  auVar2 = __cxa_allocate_exception(0x10);
  CastExceptionText<long,long>(&local_38,this_00,auVar2._8_8_);
  InvalidInputException::InvalidInputException(auVar2._0_8_,(string *)&local_38);
  __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TARGET_TYPE Cast(const INPUT_TYPE &src, Vector &result) {
		return Cast::Operation<INPUT_TYPE, TARGET_TYPE>(src);
	}